

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyFraig.c
# Opt level: O3

void Ivy_FraigRemoveClass(Ivy_FraigList_t *pList,Ivy_Obj_t *pClass)

{
  Ivy_Obj_t *pIVar1;
  Ivy_Obj_t *pIVar2;
  
  if (pList->pHead == pClass) {
    pList->pHead = pClass->pPrevFan0;
  }
  pIVar1 = pClass->pPrevFan1;
  if (pList->pTail == pClass) {
    pList->pTail = pIVar1;
  }
  pIVar2 = pClass->pPrevFan0;
  if (pIVar1 != (Ivy_Obj_t *)0x0) {
    pIVar1->pPrevFan0 = pIVar2;
  }
  if (pIVar2 != (Ivy_Obj_t *)0x0) {
    pIVar2->pPrevFan1 = pIVar1;
  }
  pClass->pPrevFan0 = (Ivy_Obj_t *)0x0;
  pClass->pPrevFan1 = (Ivy_Obj_t *)0x0;
  pClass->field_0x8 = pClass->field_0x8 & 0xef;
  pList->nItems = pList->nItems + -1;
  return;
}

Assistant:

void Ivy_FraigRemoveClass( Ivy_FraigList_t * pList, Ivy_Obj_t * pClass )
{
    if ( pList->pHead == pClass )
        pList->pHead = Ivy_ObjEquivListNext(pClass);
    if ( pList->pTail == pClass )
        pList->pTail = Ivy_ObjEquivListPrev(pClass);
    if ( Ivy_ObjEquivListPrev(pClass) )
        Ivy_ObjSetEquivListNext( Ivy_ObjEquivListPrev(pClass), Ivy_ObjEquivListNext(pClass) ); 
    if ( Ivy_ObjEquivListNext(pClass) )
        Ivy_ObjSetEquivListPrev( Ivy_ObjEquivListNext(pClass), Ivy_ObjEquivListPrev(pClass) );
    Ivy_ObjSetEquivListNext( pClass, NULL ); 
    Ivy_ObjSetEquivListPrev( pClass, NULL );
    pClass->fMarkA = 0;
    pList->nItems--;
}